

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O1

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> * __thiscall
helics::Input::getValueRef<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
          (Input *this)

{
  DataType baseType;
  bool bVar1;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> out;
  data_view dv;
  defV val;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_78;
  data_view local_60;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_40;
  undefined1 local_18;
  
  checkAndGetFedUpdate(&local_60,this);
  if (local_60.dblock._M_len == 0) {
    if (checkForNeededCoreRetrieval::locType._M_elems
        [(char)*(__index_type *)
                ((long)&(this->lastValue).
                        super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        .
                        super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                + 0x28)] != HELICS_COMPLEX_VECTOR &&
        checkForNeededCoreRetrieval::locType._M_elems
        [(char)*(__index_type *)
                ((long)&(this->lastValue).
                        super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        .
                        super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                        .
                        super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                + 0x28)] != this->injectionType) {
      forceCoreDataUpdate(this);
    }
    goto LAB_0029dc91;
  }
  if (this->injectionType == HELICS_UNKNOWN) {
    loadSourceInformation(this);
  }
  if (this->changeDetectionEnabled != true) {
    helics::valueExtract(&local_60,this->injectionType,&this->lastValue);
    goto LAB_0029dc91;
  }
  local_78.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  baseType = this->injectionType;
  if (baseType == HELICS_INT) {
    local_40._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
    local_18 = 0;
    integerExtractAndConvert
              ((defV *)&local_40._M_first,&local_60,&this->inputUnits,&this->outputUnits);
    helics::valueExtract((defV *)&local_40._M_first,&local_78);
LAB_0029dc3c:
    CLI::std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&local_40._M_first);
  }
  else {
    if (baseType == HELICS_DOUBLE) {
      local_40._M_first._M_storage =
           (_Uninitialized<double,_true>)
           doubleExtractAndConvert(&local_60,&this->inputUnits,&this->outputUnits);
      local_18 = 0;
      helics::valueExtract((defV *)&local_40._M_first,&local_78);
      goto LAB_0029dc3c;
    }
    helics::valueExtract(&local_60,baseType,&local_78);
  }
  bVar1 = changeDetected(&this->lastValue,&local_78,this->delta);
  if (bVar1) {
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->lastValue,&local_78);
  }
  if (local_78.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0029dc91:
  valueConvert(&this->lastValue,HELICS_COMPLEX_VECTOR);
  pvVar2 = std::
           get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     (&this->lastValue);
  if (local_60.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)pvVar2;
}

Assistant:

const X& Input::getValueRef()
{
    static_assert(std::is_same<typeCategory<X>, std::integral_constant<int, primaryType>>::value,
                  "calling getValue By ref must be with a primary type");
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (changeDetectionEnabled) {
            X out;
            if (injectionType == helics::DataType::HELICS_DOUBLE) {
                defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else if (injectionType == helics::DataType::HELICS_INT) {
                defV val;
                integerExtractAndConvert(val, dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else {
                valueExtract(dv, injectionType, out);
            }
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(std::move(out));
            }
        } else {
            valueExtract(dv, injectionType, lastValue);
        }
    } else {
        if (checkForNeededCoreRetrieval(lastValue.index(),
                                        injectionType,
                                        helicsType<remove_cv_ref<X>>())) {
            forceCoreDataUpdate();
        }
    }

    return getValueRefImpl<remove_cv_ref<X>>(lastValue);
}